

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O0

string * util::encoding_name_abi_cxx11_(codepage_id codepage)

{
  ostream *this;
  codepage_id in_ESI;
  string *in_RDI;
  ostringstream oss;
  char *name;
  ostringstream local_1a8 [8];
  allocator<char> *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  allocator<char> local_19;
  char *local_18;
  codepage_id local_c;
  
  local_c = in_ESI;
  local_18 = anon_unknown_0::get_encoding_name(in_ESI);
  if (local_18 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    this = std::operator<<((ostream *)local_1a8,"Windows-");
    std::ostream::operator<<(this,local_c);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::allocator<char>::~allocator(&local_19);
  }
  return in_RDI;
}

Assistant:

std::string encoding_name(codepage_id codepage) {
	
	const char * name = get_encoding_name(codepage);
	if(name) {
		return name;
	}
	
	std::ostringstream oss;
	oss << "Windows-" << codepage;
	
	return oss.str();
}